

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O0

GetWitnessStackNumResponseStruct *
cfd::js::api::ElementsTransactionStructApi::GetWitnessStackNum
          (GetWitnessStackNumResponseStruct *__return_storage_ptr__,
          GetWitnessStackNumRequestStruct *request)

{
  GetWitnessStackNumRequestStruct *this;
  string *in_R8;
  allocator local_111;
  function<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&)>
  local_110;
  undefined1 local_f0 [214];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  GetWitnessStackNumRequestStruct *pGStack_18;
  anon_class_1_0_00000001 call_func;
  GetWitnessStackNumRequestStruct *request_local;
  GetWitnessStackNumResponseStruct *result;
  
  local_1a = 0;
  pGStack_18 = request;
  GetWitnessStackNumResponseStruct::GetWitnessStackNumResponseStruct(__return_storage_ptr__);
  this = pGStack_18;
  std::
  function<cfd::js::api::GetWitnessStackNumResponseStruct(cfd::js::api::GetWitnessStackNumRequestStruct_const&)>
  ::
  function<cfd::js::api::ElementsTransactionStructApi::GetWitnessStackNum(cfd::js::api::GetWitnessStackNumRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::GetWitnessStackNumResponseStruct(cfd::js::api::GetWitnessStackNumRequestStruct_const&)>
              *)local_f0,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"GetWitnessStackNum",&local_111);
  ExecuteStructApi<cfd::js::api::GetWitnessStackNumRequestStruct,cfd::js::api::GetWitnessStackNumResponseStruct>
            ((GetWitnessStackNumResponseStruct *)(local_f0 + 0x20),(api *)this,
             (GetWitnessStackNumRequestStruct *)local_f0,&local_110,in_R8);
  GetWitnessStackNumResponseStruct::operator=
            (__return_storage_ptr__,(GetWitnessStackNumResponseStruct *)(local_f0 + 0x20));
  GetWitnessStackNumResponseStruct::~GetWitnessStackNumResponseStruct
            ((GetWitnessStackNumResponseStruct *)(local_f0 + 0x20));
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::
  function<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&)>
  ::~function((function<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&)>
               *)local_f0);
  return __return_storage_ptr__;
}

Assistant:

GetWitnessStackNumResponseStruct
ElementsTransactionStructApi::GetWitnessStackNum(
    const GetWitnessStackNumRequestStruct& request) {
  auto call_func = [](const GetWitnessStackNumRequestStruct& request)
      -> GetWitnessStackNumResponseStruct {  // NOLINT
    GetWitnessStackNumResponseStruct response;

    ElementsTransactionApi api;
    uint32_t count = api.GetWitnessStackNum(
        request.tx, Txid(request.txin.txid), request.txin.vout);

    response.count = count;
    return response;
  };

  GetWitnessStackNumResponseStruct result;
  result = ExecuteStructApi<
      GetWitnessStackNumRequestStruct, GetWitnessStackNumResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}